

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_helper_unpolar<ExchCXX::BuiltinR2SCAN_X>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  double rho_00;
  long lVar1;
  double sigma_00;
  double dVar2;
  double tau_00;
  
  if (0 < N) {
    lVar1 = 0;
    do {
      rho_00 = *(double *)((long)rho + lVar1);
      if (rho_00 <= 1e-11) {
        *(double *)((long)eps + lVar1) = 0.0;
      }
      else {
        dVar2 = 4.641588833612795e-30;
        if (4.641588833612795e-30 <= *(double *)((long)sigma + lVar1)) {
          dVar2 = *(double *)((long)sigma + lVar1);
        }
        tau_00 = 1e-20;
        if (1e-20 <= *(double *)((long)tau + lVar1)) {
          tau_00 = *(double *)((long)tau + lVar1);
        }
        sigma_00 = rho_00 * 8.0 * tau_00;
        if (dVar2 <= sigma_00) {
          sigma_00 = dVar2;
        }
        kernel_traits<ExchCXX::BuiltinR2SCAN_X>::eval_exc_unpolar_impl
                  (rho_00,sigma_00,0.0,tau_00,(double *)((long)eps + lVar1));
      }
      lVar1 = lVar1 + 8;
    } while ((ulong)(uint)N << 3 != lVar1);
  }
  return;
}

Assistant:

MGGA_EXC_GENERATOR( host_eval_exc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const double lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    traits::eval_exc_unpolar( rho[i], sigma[i], lapl_i, tau[i], eps[i] );

  }

}